

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall
client_socket::client_socket
          (client_socket *this,epoll *ep,file_descriptor *fd,on_ready_t *on_disconnect)

{
  _Manager_type p_Var1;
  file_descriptor local_7c;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  file_descriptor::file_descriptor(&local_7c,fd);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  local_60 = on_disconnect->_M_invoker;
  p_Var1 = (on_disconnect->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(on_disconnect->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(on_disconnect->super__Function_base)._M_functor + 8);
    (on_disconnect->super__Function_base)._M_manager = (_Manager_type)0x0;
    on_disconnect->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var1;
  }
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  client_socket(this,ep,&local_7c,(on_ready_t *)&local_78,(on_ready_t *)&local_38,
                (on_ready_t *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  file_descriptor::~file_descriptor(&local_7c);
  return;
}

Assistant:

client_socket::client_socket(sysapi::epoll &ep, file_descriptor fd, on_ready_t on_disconnect)
    : client_socket(ep, std::move(fd), std::move(on_disconnect), on_ready_t{}, on_ready_t{})
{}